

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p448(mbedtls_mpi *N)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  ulong uVar3;
  mbedtls_mpi M;
  mbedtls_mpi Q;
  mbedtls_mpi_uint Mp [8];
  mbedtls_mpi_uint Qp [7];
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi_uint local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  mbedtls_mpi_uint local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  ulong uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  iVar2 = 0;
  if (7 < N->n) {
    local_c0.s = 1;
    local_c0.n = N->n - 7;
    iVar2 = -0x4f80;
    if (local_c0.n < 8) {
      local_c0.p = &local_88;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      pmVar1 = N->p;
      memcpy(local_c0.p,pmVar1 + 7,local_c0.n * 8);
      uVar3 = 7;
      do {
        pmVar1[uVar3] = 0;
        uVar3 = uVar3 + 1;
      } while (uVar3 < N->n);
      iVar2 = mbedtls_mpi_add_mpi(N,N,&local_c0);
      if (iVar2 == 0) {
        local_a8._4_4_ = local_c0._4_4_;
        local_a8.s = local_c0.s;
        local_a8.n = local_c0.n;
        local_a8.p = &local_48;
        local_48 = local_88;
        uStack_40 = uStack_80;
        local_38 = local_78;
        uStack_30 = uStack_70;
        local_28 = local_68;
        uStack_20 = uStack_60;
        local_18 = local_58;
        iVar2 = mbedtls_mpi_shift_r(&local_a8,0xe0);
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_add_mpi(N,N,&local_a8), iVar2 == 0)) {
          uStack_70 = uStack_70 & 0xffffffff;
          if (4 < local_c0.n) {
            memset(&local_68,0,local_c0.n * 8 - 0x20);
          }
          iVar2 = mbedtls_mpi_add_mpi(&local_c0,&local_c0,&local_a8);
          if (iVar2 == 0) {
            local_c0.n = 8;
            iVar2 = mbedtls_mpi_shift_l(&local_c0,0xe0);
            if (iVar2 == 0) {
              iVar2 = mbedtls_mpi_add_mpi(N,N,&local_c0);
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int ecp_mod_p448( mbedtls_mpi *N )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi M, Q;
    mbedtls_mpi_uint Mp[P448_WIDTH + 1], Qp[P448_WIDTH];

    if( N->n <= P448_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P448_WIDTH );
    if( M.n > P448_WIDTH )
        /* Shouldn't be called with N larger than 2^896! */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    M.p = Mp;
    memset( Mp, 0, sizeof( Mp ) );
    memcpy( Mp, N->p + P448_WIDTH, M.n * sizeof( mbedtls_mpi_uint ) );

    /* N = A0 */
    for( i = P448_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N += A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &M ) );

    /* Q = B1, N += B1 */
    Q = M;
    Q.p = Qp;
    memcpy( Qp, Mp, sizeof( Qp ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Q, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &Q ) );

    /* M = (B0 + B1) * 2^224, N += M */
    if( sizeof( mbedtls_mpi_uint ) > 4 )
        Mp[P224_WIDTH_MIN] &= ( (mbedtls_mpi_uint)-1 ) >> ( P224_UNUSED_BITS );
    for( i = P224_WIDTH_MAX; i < M.n; ++i )
        Mp[i] = 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &M, &M, &Q ) );
    M.n = P448_WIDTH + 1; /* Make room for shifted carry bit from the addition */
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &M, 224 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &M ) );

cleanup:
    return( ret );
}